

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::
     MatchPrintAndExplain<std::optional<google::protobuf::io::AnnotationCollector::Semantic>const,std::optional<google::protobuf::io::AnnotationCollector::Semantic>const&>
               (optional<google::protobuf::io::AnnotationCollector::Semantic> *value,
               Matcher<const_std::optional<google::protobuf::io::AnnotationCollector::Semantic>_&>
               *matcher,MatchResultListener *listener)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  StringMatchResultListener inner_listener;
  string sStack_1f8;
  string local_1d8;
  StringMatchResultListener local_1b8;
  
  if (listener->stream_ != (ostream *)0x0) {
    StringMatchResultListener::StringMatchResultListener(&local_1b8);
    bVar1 = MatcherBase<const_std::optional<google::protobuf::io::AnnotationCollector::Semantic>_&>
            ::MatchAndExplain(&matcher->
                               super_MatcherBase<const_std::optional<google::protobuf::io::AnnotationCollector::Semantic>_&>
                              ,value,&local_1b8.super_MatchResultListener);
    UniversalPrinter<std::optional<google::protobuf::io::AnnotationCollector::Semantic>_>::Print
              (value,listener->stream_);
    GetTypeName<std::optional<google::protobuf::io::AnnotationCollector::Semantic>const>();
    bVar2 = IsReadableTypeName(&sStack_1f8);
    if (bVar2) {
      poVar3 = std::operator<<(listener->stream_," (of type ");
      poVar3 = std::operator<<(poVar3,(string *)&sStack_1f8);
      std::operator<<(poVar3,")");
    }
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_1d8,listener->stream_);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&sStack_1f8);
    StringMatchResultListener::~StringMatchResultListener(&local_1b8);
    return bVar1;
  }
  bVar1 = MatcherBase<const_std::optional<google::protobuf::io::AnnotationCollector::Semantic>_&>::
          Matches(&matcher->
                   super_MatcherBase<const_std::optional<google::protobuf::io::AnnotationCollector::Semantic>_&>
                  ,value);
  return bVar1;
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}